

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O0

int run_test_tcp_bind_or_listen_error_after_close(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  uv_tcp_t tcp;
  
  memset(&eval_a,0,0x10);
  eval_a._4_4_ = htonl(0);
  eval_a._2_2_ = htons(9999);
  eval_a._0_2_ = 2;
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,(uv_tcp_t *)addr.sin_zero);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x136,"uv_tcp_init(uv_default_loop(), &tcp)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_close((uv_handle_t *)addr.sin_zero,(uv_close_cb)0x0);
  iVar1 = uv_tcp_bind((uv_tcp_t *)addr.sin_zero,(sockaddr *)&eval_a,0);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x138,"uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0)","==","UV_EINVAL",(long)iVar1,
            "==",0xffffffffffffffea);
    abort();
  }
  iVar1 = uv_listen((uv_stream_t *)addr.sin_zero,5,(uv_connection_cb)0x0);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x139,"uv_listen((uv_stream_t*) &tcp, 5, ((void*)0))","==","UV_EINVAL",(long)iVar1,"=="
            ,0xffffffffffffffea);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x13a,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x13b,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(tcp_bind_or_listen_error_after_close) {
  uv_tcp_t tcp;
  struct sockaddr_in addr;

  memset(&addr, 0, sizeof(addr));
  addr.sin_addr.s_addr = htonl(INADDR_ANY);
  addr.sin_port = htons(9999);
  addr.sin_family = AF_INET;

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &tcp));
  uv_close((uv_handle_t*) &tcp, NULL);
  ASSERT_EQ(uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0), UV_EINVAL);
  ASSERT_EQ(uv_listen((uv_stream_t*) &tcp, 5, NULL), UV_EINVAL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}